

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_hash.c
# Opt level: O0

void * ngx_hash_find_wc_head(ngx_hash_wildcard_t *hwc,u_char *name,size_t len)

{
  ngx_hash_wildcard_t *hwc_00;
  ngx_uint_t local_48;
  ngx_uint_t key;
  ngx_uint_t n;
  ngx_uint_t i;
  void *value;
  size_t len_local;
  u_char *name_local;
  ngx_hash_wildcard_t *hwc_local;
  
  for (key = len; (key != 0 && (name[key - 1] != '.')); key = key - 1) {
  }
  local_48 = 0;
  for (n = key; n < len; n = n + 1) {
    local_48 = local_48 * 0x1f + (ulong)name[n];
  }
  hwc_local = (ngx_hash_wildcard_t *)ngx_hash_find(&hwc->hash,local_48,name + key,len - key);
  if (hwc_local == (ngx_hash_wildcard_t *)0x0) {
    hwc_local = (ngx_hash_wildcard_t *)hwc->value;
  }
  else if (((ulong)hwc_local & 2) == 0) {
    if (((ulong)hwc_local & 1) != 0) {
      if (key == 0) {
        hwc_local = (ngx_hash_wildcard_t *)0x0;
      }
      else {
        hwc_local = (ngx_hash_wildcard_t *)((ulong)hwc_local & 0xfffffffffffffffc);
      }
    }
  }
  else if (key == 0) {
    if (((ulong)hwc_local & 1) == 0) {
      hwc_local = *(ngx_hash_wildcard_t **)(((ulong)hwc_local & 0xfffffffffffffffc) + 0x10);
    }
    else {
      hwc_local = (ngx_hash_wildcard_t *)0x0;
    }
  }
  else {
    hwc_00 = (ngx_hash_wildcard_t *)((ulong)hwc_local & 0xfffffffffffffffc);
    hwc_local = (ngx_hash_wildcard_t *)ngx_hash_find_wc_head(hwc_00,name,key - 1);
    if (hwc_local == (ngx_hash_wildcard_t *)0x0) {
      hwc_local = (ngx_hash_wildcard_t *)hwc_00->value;
    }
  }
  return hwc_local;
}

Assistant:

void *
ngx_hash_find_wc_head(ngx_hash_wildcard_t *hwc, u_char *name, size_t len)
{
    void        *value;
    ngx_uint_t   i, n, key;

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "wch:\"%*s\"", len, name);
#endif

    n = len;

    while (n) {
        if (name[n - 1] == '.') {
            break;
        }

        n--;
    }

    key = 0;

    for (i = n; i < len; i++) {
        key = ngx_hash(key, name[i]);
    }

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "key:\"%ui\"", key);
#endif

    value = ngx_hash_find(&hwc->hash, key, &name[n], len - n);

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "value:\"%p\"", value);
#endif

    if (value) {

        /*
         * the 2 low bits of value have the special meaning:
         *     00 - value is data pointer for both "example.com"
         *          and "*.example.com";
         *     01 - value is data pointer for "*.example.com" only;
         *     10 - value is pointer to wildcard hash allowing
         *          both "example.com" and "*.example.com";
         *     11 - value is pointer to wildcard hash allowing
         *          "*.example.com" only.
         */

        if ((uintptr_t) value & 2) {

            if (n == 0) {

                /* "example.com" */

                if ((uintptr_t) value & 1) {
                    return NULL;
                }

                hwc = (ngx_hash_wildcard_t *)
                                          ((uintptr_t) value & (uintptr_t) ~3);
                return hwc->value;
            }

            hwc = (ngx_hash_wildcard_t *) ((uintptr_t) value & (uintptr_t) ~3);

            value = ngx_hash_find_wc_head(hwc, name, n - 1);

            if (value) {
                return value;
            }

            return hwc->value;
        }

        if ((uintptr_t) value & 1) {

            if (n == 0) {

                /* "example.com" */

                return NULL;
            }

            return (void *) ((uintptr_t) value & (uintptr_t) ~3);
        }

        return value;
    }

    return hwc->value;
}